

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O2

void __thiscall
CTB<UF>::PerformLabelingMem
          (CTB<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  Mat1b *pMVar4;
  pointer puVar5;
  pointer piVar6;
  int r_i;
  undefined4 uVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  long lVar14;
  int c;
  ulong uVar15;
  long lVar16;
  void *in_R8;
  long lVar17;
  int c_i;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  MemMat<int> img_labels;
  allocator_type local_1e9 [9];
  long local_1e0;
  MemMat<unsigned_char> img;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar2;
  local_f8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  UF::MemSetup();
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar8 = *(uint *)&pMVar4->field_0xc;
  lVar10 = (long)(int)uVar8;
  uVar18 = 0;
  uVar19 = 0;
  if (0 < (int)uVar8) {
    uVar19 = (ulong)uVar8;
  }
  lVar22 = (long)*(int *)&pMVar4->field_0x8;
  local_1e0 = lVar22;
  do {
    if (lVar22 <= (long)uVar18) {
      uVar8 = UF::MemFlatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
      for (lVar10 = 0;
          piVar6 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          puVar5 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start, lVar10 < img_labels.rows;
          lVar10 = lVar10 + 1) {
        for (lVar22 = 0; lVar22 < img_labels.cols; lVar22 = lVar22 + 1) {
          lVar14 = *(long *)img_labels.accesses_._72_8_ * lVar10 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar14 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = *(long *)img_labels.img_._72_8_ * lVar10 + img_labels.img_._16_8_;
          iVar13 = *(int *)(lVar21 + lVar22 * 4);
          piVar6[iVar13] = piVar6[iVar13] + 1;
          uVar8 = puVar5[iVar13];
          piVar1 = (int *)(lVar14 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar21 + lVar22 * 4) = uVar8;
        }
        in_R8 = (void *)img_labels.img_._72_8_;
      }
      local_100 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100,
                 local_1e9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(accesses,&local_f0)
      ;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
      dVar24 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24;
      dVar24 = MemMat<int>::GetTotalAccesses(&img_labels);
      (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24;
      dVar24 = UF::MemTotalAccesses();
      uVar18 = (ulong)dVar24;
      pvVar12 = (void *)((long)(dVar24 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18);
      (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)pvVar12;
      cv::Mat_<int>::clone
                (&local_f0,(__fn *)&img_labels.img_,pvVar12,(int)((long)uVar18 >> 0x3f),in_R8);
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_f0.super_Mat);
      cv::Mat::~Mat(&local_f0.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    pvVar12 = (void *)(uVar18 - 1);
    uVar20 = uVar18 | 1;
    iVar13 = -1;
    uVar7 = 0xffffffff;
    for (uVar15 = 0; uVar15 != uVar19; uVar15 = uVar15 + 1) {
      uVar2 = local_1e9._1_8_;
      switch(uVar7) {
      case 1:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) != '\0') {
          if (uVar18 == 0) {
LAB_001999a9:
            uVar8 = UF::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar18 +
                             img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar18 + img_labels.img_._16_8_ + uVar15 * 4
                     ) = uVar8;
LAB_001999dc:
            iVar13 = 6;
          }
          else {
            lVar14 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
            piVar1 = (int *)(lVar14 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = img.img_._16_8_ + lVar21 * (long)pvVar12;
            if (*(char *)(uVar15 + lVar21) == '\0') {
              if ((lVar10 <= (long)(uVar15 + 1)) ||
                 (piVar1 = (int *)(lVar14 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + 1 + uVar15) == '\0')) {
                if ((uVar15 == 0) ||
                   (piVar1 = (int *)(lVar14 + -4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar21 + -1 + uVar15) == '\0')) goto LAB_001999a9;
                lVar14 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + -4 +
                                uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)img_labels.img_._72_8_;
                uVar7 = *(undefined4 *)
                         (lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + -4 + uVar15 * 4);
                piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4) = uVar7;
                in_R8 = pvVar12;
                goto LAB_001999dc;
              }
              lVar16 = *(long *)img_labels.accesses_._72_8_;
              lVar23 = lVar16 * (long)pvVar12 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar23 + 4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar17 = *(long *)img_labels.img_._72_8_;
              in_R8 = (void *)(lVar17 * (long)pvVar12 + img_labels.img_._16_8_);
              uVar7 = *(undefined4 *)((long)in_R8 + uVar15 * 4 + 4);
              lVar16 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar16 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar17 = lVar17 * uVar18 + img_labels.img_._16_8_;
              *(undefined4 *)(lVar17 + uVar15 * 4) = uVar7;
              iVar13 = 5;
              if ((uVar15 != 0) &&
                 (piVar1 = (int *)(lVar14 + -4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + -1 + uVar15) != '\0')) {
                piVar1 = (int *)(lVar16 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar8 = *(uint *)(lVar17 + uVar15 * 4);
                piVar1 = (int *)(lVar23 + -4 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                UF::MemMerge(uVar8,*(uint *)((long)in_R8 + uVar15 * 4 + -4));
                iVar13 = 5;
              }
            }
            else {
              lVar14 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar7 = *(undefined4 *)(lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + uVar15 * 4);
              piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4) = uVar7;
              iVar13 = 4;
            }
          }
          goto LAB_001999df;
        }
        if ((lVar22 <= (long)uVar20) ||
           (piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * uVar20 + uVar15 * 4),
           *piVar1 = *piVar1 + 1, *(char *)(uVar15 + img.img_._16_8_ + lVar21 * uVar20) == '\0'))
        goto LAB_00198f3e;
        uVar8 = UF::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar20 + img_labels.accesses_._16_8_
                        + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar14 = *(long *)img_labels.img_._72_8_ * uVar20 + img_labels.img_._16_8_;
        uVar7 = 3;
        goto LAB_00199a6e;
      case 2:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) != '\0') {
          if (iVar13 == 6) {
            lVar22 = *(long *)img_labels.accesses_._72_8_;
            local_1e9[1] = (allocator_type)img_labels.accesses_._16_1_;
            local_1e9[2] = (allocator_type)img_labels.accesses_._17_1_;
            local_1e9[3] = (allocator_type)img_labels.accesses_._18_1_;
            local_1e9[4] = (allocator_type)img_labels.accesses_._19_1_;
            local_1e9[5] = (allocator_type)img_labels.accesses_._20_1_;
            local_1e9[6] = (allocator_type)img_labels.accesses_._21_1_;
            local_1e9[7] = (allocator_type)img_labels.accesses_._22_1_;
            local_1e9[8] = (allocator_type)img_labels.accesses_._23_1_;
            lVar23 = lVar22 * uVar18 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar23 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar16 = *(long *)img_labels.img_._72_8_;
            lVar17 = lVar16 * uVar18 + img_labels.img_._16_8_;
            uVar7 = *(undefined4 *)(lVar17 + -4 + uVar15 * 4);
            piVar1 = (int *)(lVar23 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar17 + uVar15 * 4) = uVar7;
            iVar13 = 6;
            uVar7 = 2;
            in_R8 = (void *)img_labels.accesses_._16_8_;
            uVar2 = local_1e9._1_8_;
            if (uVar18 != 0) {
              in_R8 = (void *)(uVar15 + 1);
              uVar7 = 2;
              if ((long)in_R8 < lVar10) {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + 4 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar7 = 2;
                if (*(char *)(uVar15 + 1 + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0') {
                  piVar1 = (int *)(lVar23 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar8 = *(uint *)(lVar17 + uVar15 * 4);
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar22 * (long)pvVar12 + 4 +
                                  uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  UF::MemMerge(uVar8,*(uint *)(img_labels.img_._16_8_ + lVar16 * (long)pvVar12 + 4 +
                                              uVar15 * 4));
                  uVar7 = 2;
                  goto LAB_00198dae;
                }
              }
            }
          }
          else if (iVar13 == 5) {
LAB_00198d73:
            lVar22 = *(long *)img_labels.accesses_._72_8_ * uVar18 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar22 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_ * uVar18 + img_labels.img_._16_8_;
            uVar7 = *(undefined4 *)(lVar14 + -4 + uVar15 * 4);
            piVar1 = (int *)(lVar22 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar14 + uVar15 * 4) = uVar7;
            uVar7 = 5;
LAB_00198dae:
            uVar2 = local_1e9._1_8_;
            iVar13 = 5;
          }
          else {
            uVar7 = 2;
            if (iVar13 == 4) {
              lVar16 = *(long *)img_labels.accesses_._72_8_;
              lVar17 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar17 + -4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar22 = *(long *)img_labels.img_._72_8_;
              lVar23 = lVar22 * uVar18 + img_labels.img_._16_8_;
              uVar7 = *(undefined4 *)(lVar23 + -4 + uVar15 * 4);
              piVar1 = (int *)(lVar17 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar23 + uVar15 * 4) = uVar7;
              iVar13 = 6;
              uVar7 = 4;
              in_R8 = (void *)img_labels.accesses_._16_8_;
              if (uVar18 != 0) {
                lVar11 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
                piVar1 = (int *)(lVar11 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = img.img_._16_8_ + lVar21 * (long)pvVar12;
                uVar7 = 4;
                iVar13 = 4;
                if (*(char *)(uVar15 + lVar14) == '\0') {
                  iVar13 = 6;
                  uVar7 = 4;
                  if ((long)(uVar15 + 1) < lVar10) {
                    piVar1 = (int *)(lVar11 + 4 + uVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar7 = 4;
                    if (*(char *)(lVar14 + 1 + uVar15) != '\0') {
                      piVar1 = (int *)(lVar17 + uVar15 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar8 = *(uint *)(lVar23 + uVar15 * 4);
                      in_R8 = (void *)(img_labels.accesses_._16_8_ + lVar16 * (long)pvVar12);
                      piVar1 = (int *)((long)in_R8 + uVar15 * 4 + 4);
                      *piVar1 = *piVar1 + 1;
                      goto LAB_001991ad;
                    }
                  }
                }
              }
            }
          }
          goto LAB_00198db0;
        }
LAB_00198d49:
        if (lVar22 <= (long)uVar20) goto LAB_00198f3e;
        piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * uVar20 + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar15 + img.img_._16_8_ + lVar21 * uVar20);
joined_r0x00198e39:
        if (cVar3 == '\0') goto LAB_00198f3e;
        lVar14 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img_labels.img_._72_8_;
        uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + -4 + uVar15 * 4);
        piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar14 = lVar21 * uVar20 + img_labels.img_._16_8_;
LAB_00198e8c:
        uVar7 = 7;
LAB_00199a6e:
        *(uint *)(lVar14 + uVar15 * 4) = uVar8;
        break;
      case 3:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) == '\0') goto LAB_00198b8a;
        if (uVar18 == 0) {
LAB_00199609:
          lVar16 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar16 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar17 = *(long *)img_labels.img_._72_8_;
          uVar7 = *(undefined4 *)(lVar17 * uVar20 + img_labels.img_._16_8_ + -4 + uVar15 * 4);
          lVar23 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar23 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar11 = lVar17 * uVar18 + img_labels.img_._16_8_;
          *(undefined4 *)(lVar11 + uVar15 * 4) = uVar7;
          iVar13 = 6;
          in_R8 = (void *)img_labels.accesses_._16_8_;
          lVar22 = local_1e0;
          if (uVar15 != 0 && uVar18 != 0) {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            iVar13 = 6;
            if (*(char *)((uVar15 - 1) + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0') {
              piVar1 = (int *)(lVar23 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar8 = *(uint *)(lVar11 + uVar15 * 4);
              in_R8 = (void *)(img_labels.accesses_._16_8_ + lVar16 * (long)pvVar12);
              piVar1 = (int *)((long)in_R8 + uVar15 * 4 + -4);
              *piVar1 = *piVar1 + 1;
              puVar9 = (uint *)(img_labels.img_._16_8_ + lVar17 * (long)pvVar12 + (uVar15 - 1) * 4);
              goto LAB_001996c6;
            }
          }
        }
        else {
          lVar22 = lVar14 * (long)pvVar12 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar22 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar16 = lVar21 * (long)pvVar12 + img.img_._16_8_;
          if (*(char *)(uVar15 + lVar16) == '\0') {
            if ((lVar10 <= (long)(uVar15 + 1)) ||
               (piVar1 = (int *)(lVar22 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar16 + 1 + uVar15) == '\0')) goto LAB_00199609;
            lVar22 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar22 * (long)pvVar12 + img_labels.accesses_._16_8_ + 4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_;
            uVar7 = *(undefined4 *)
                     (lVar14 * (long)pvVar12 + img_labels.img_._16_8_ + 4 + uVar15 * 4);
            in_R8 = (void *)(lVar22 * uVar18 + img_labels.accesses_._16_8_);
            piVar1 = (int *)((long)in_R8 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = lVar14 * uVar18 + img_labels.img_._16_8_;
            *(undefined4 *)(lVar21 + uVar15 * 4) = uVar7;
            piVar1 = (int *)((long)in_R8 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            uVar8 = *(uint *)(lVar21 + uVar15 * 4);
            piVar1 = (int *)(lVar22 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            UF::MemMerge(uVar8,*(uint *)(lVar14 * uVar20 + img_labels.img_._16_8_ + -4 + uVar15 * 4)
                        );
            iVar13 = 5;
            lVar22 = local_1e0;
            if ((uVar15 == 0) ||
               (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar12 +
                                 img.accesses_._16_8_ + -4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
               *(char *)((uVar15 - 1) + *(long *)img.img_._72_8_ * (long)pvVar12 + img.img_._16_8_)
               == '\0')) goto LAB_001998a8;
            lVar22 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar22 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_;
            uVar8 = *(uint *)(lVar14 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
            piVar1 = (int *)(lVar22 * (long)pvVar12 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4)
            ;
            *piVar1 = *piVar1 + 1;
            in_R8 = (void *)(lVar14 * (long)pvVar12 + img_labels.img_._16_8_);
            puVar9 = (uint *)((long)in_R8 + (uVar15 - 1) * 4);
          }
          else {
            lVar22 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar22 * (long)pvVar12 + img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_;
            uVar7 = *(undefined4 *)(lVar14 * (long)pvVar12 + img_labels.img_._16_8_ + uVar15 * 4);
            in_R8 = (void *)(lVar22 * uVar18 + img_labels.accesses_._16_8_);
            piVar1 = (int *)((long)in_R8 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = lVar14 * uVar18 + img_labels.img_._16_8_;
            *(undefined4 *)(lVar21 + uVar15 * 4) = uVar7;
            piVar1 = (int *)((long)in_R8 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            uVar8 = *(uint *)(lVar21 + uVar15 * 4);
            piVar1 = (int *)(lVar22 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            puVar9 = (uint *)(lVar14 * uVar20 + img_labels.img_._16_8_ + uVar15 * 4 + -4);
            iVar13 = 4;
          }
LAB_001996c6:
          UF::MemMerge(uVar8,*puVar9);
          lVar22 = local_1e0;
        }
LAB_001998a8:
        if (((long)uVar20 < lVar22) &&
           (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar20 + img.accesses_._16_8_ +
                            uVar15 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar15 + *(long *)img.img_._72_8_ * uVar20 + img.img_._16_8_) != '\0')) {
          lVar14 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = *(long *)img_labels.img_._72_8_;
          uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
          piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = lVar21 * uVar20 + img_labels.img_._16_8_;
          uVar7 = 8;
          goto LAB_00199a6e;
        }
        uVar7 = 8;
        break;
      case 4:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) == '\0') goto LAB_00198d49;
        if (iVar13 == 6) {
          lVar16 = *(long *)img_labels.accesses_._72_8_;
          local_1e9[1] = (allocator_type)img_labels.accesses_._16_1_;
          local_1e9[2] = (allocator_type)img_labels.accesses_._17_1_;
          local_1e9[3] = (allocator_type)img_labels.accesses_._18_1_;
          local_1e9[4] = (allocator_type)img_labels.accesses_._19_1_;
          local_1e9[5] = (allocator_type)img_labels.accesses_._20_1_;
          local_1e9[6] = (allocator_type)img_labels.accesses_._21_1_;
          local_1e9[7] = (allocator_type)img_labels.accesses_._22_1_;
          local_1e9[8] = (allocator_type)img_labels.accesses_._23_1_;
          lVar23 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar23 + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar22 = *(long *)img_labels.img_._72_8_;
          lVar17 = lVar22 * uVar18 + img_labels.img_._16_8_;
          uVar7 = *(undefined4 *)(lVar17 + -4 + uVar15 * 4);
          piVar1 = (int *)(lVar23 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar17 + uVar15 * 4) = uVar7;
          uVar7 = 4;
          in_R8 = (void *)img_labels.accesses_._16_8_;
          uVar2 = local_1e9._1_8_;
          iVar13 = 6;
          if (uVar18 != 0) {
            in_R8 = (void *)(uVar15 + 1);
            uVar7 = 4;
            iVar13 = 6;
            if ((long)in_R8 < lVar10) {
              piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + 4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar7 = 4;
              if (*(char *)(uVar15 + 1 + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0') {
                piVar1 = (int *)(lVar23 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar8 = *(uint *)(lVar17 + uVar15 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar16 * (long)pvVar12 + 4 +
                                uVar15 * 4);
                *piVar1 = *piVar1 + 1;
LAB_001991ad:
                UF::MemMerge(uVar8,*(uint *)(img_labels.img_._16_8_ + lVar22 * (long)pvVar12 + 4 +
                                            uVar15 * 4));
                uVar7 = 4;
                goto LAB_00198dae;
              }
            }
          }
        }
        else {
          if (iVar13 == 5) goto LAB_00198d73;
          uVar7 = 4;
          if (iVar13 == 4) {
            lVar16 = *(long *)img_labels.accesses_._72_8_;
            lVar17 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar17 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar22 = *(long *)img_labels.img_._72_8_;
            lVar23 = lVar22 * uVar18 + img_labels.img_._16_8_;
            uVar7 = *(undefined4 *)(lVar23 + -4 + uVar15 * 4);
            piVar1 = (int *)(lVar17 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 + uVar15 * 4) = uVar7;
            uVar7 = 4;
            in_R8 = (void *)img_labels.accesses_._16_8_;
            iVar13 = 6;
            if (uVar18 != 0) {
              lVar11 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
              piVar1 = (int *)(lVar11 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = img.img_._16_8_ + lVar21 * (long)pvVar12;
              uVar7 = 4;
              iVar13 = 4;
              if (*(char *)(uVar15 + lVar14) == '\0') {
                uVar7 = 4;
                iVar13 = 6;
                if ((long)(uVar15 + 1) < lVar10) {
                  piVar1 = (int *)(lVar11 + 4 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar7 = 4;
                  if (*(char *)(lVar14 + 1 + uVar15) != '\0') {
                    piVar1 = (int *)(lVar17 + uVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar8 = *(uint *)(lVar23 + uVar15 * 4);
                    in_R8 = (void *)(img_labels.accesses_._16_8_ + lVar16 * (long)pvVar12);
                    piVar1 = (int *)((long)in_R8 + uVar15 * 4 + 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_001991ad;
                  }
                }
              }
            }
          }
        }
        goto LAB_00198db0;
      case 5:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) == '\0') {
          if (lVar22 <= (long)uVar20) goto LAB_00198f3e;
          piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * uVar20 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(uVar15 + img.img_._16_8_ + lVar21 * uVar20);
          goto joined_r0x00198e39;
        }
        lVar22 = *(long *)img_labels.accesses_._72_8_;
        lVar17 = lVar22 * uVar18 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar17 + -4 + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar16 = *(long *)img_labels.img_._72_8_;
        lVar23 = lVar16 * uVar18 + img_labels.img_._16_8_;
        uVar7 = *(undefined4 *)(lVar23 + -4 + uVar15 * 4);
        piVar1 = (int *)(lVar17 + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar23 + uVar15 * 4) = uVar7;
        iVar13 = 6;
        in_R8 = (void *)img_labels.img_._16_8_;
        if (uVar18 != 0) {
          lVar14 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
          piVar1 = (int *)(lVar14 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = img.img_._16_8_ + lVar21 * (long)pvVar12;
          iVar13 = 4;
          if (((*(char *)(uVar15 + lVar21) == '\0') && (iVar13 = 6, (long)(uVar15 + 1) < lVar10)) &&
             (piVar1 = (int *)(lVar14 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(lVar21 + 1 + uVar15) != '\0')) {
            piVar1 = (int *)(lVar17 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            uVar8 = *(uint *)(lVar23 + uVar15 * 4);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar22 * (long)pvVar12 + 4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            in_R8 = (void *)(img_labels.img_._16_8_ + lVar16 * (long)pvVar12);
            UF::MemMerge(uVar8,*(uint *)((long)in_R8 + uVar15 * 4 + 4));
            iVar13 = 5;
          }
        }
        lVar22 = local_1e0;
        if (((long)uVar20 < local_1e0) &&
           (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar20 + img.accesses_._16_8_ +
                            uVar15 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar15 + *(long *)img.img_._72_8_ * uVar20 + img.img_._16_8_) != '\0')) {
          lVar14 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = *(long *)img_labels.img_._72_8_;
          uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
          piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = lVar21 * uVar20 + img_labels.img_._16_8_;
          uVar7 = 4;
          goto LAB_00199a6e;
        }
        uVar7 = 4;
        break;
      case 6:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) == '\0') goto LAB_00198d49;
        if (iVar13 == 6) {
          lVar22 = *(long *)img_labels.accesses_._72_8_;
          local_1e9[1] = (allocator_type)img_labels.accesses_._16_1_;
          local_1e9[2] = (allocator_type)img_labels.accesses_._17_1_;
          local_1e9[3] = (allocator_type)img_labels.accesses_._18_1_;
          local_1e9[4] = (allocator_type)img_labels.accesses_._19_1_;
          local_1e9[5] = (allocator_type)img_labels.accesses_._20_1_;
          local_1e9[6] = (allocator_type)img_labels.accesses_._21_1_;
          local_1e9[7] = (allocator_type)img_labels.accesses_._22_1_;
          local_1e9[8] = (allocator_type)img_labels.accesses_._23_1_;
          lVar23 = lVar22 * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar23 + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar16 = *(long *)img_labels.img_._72_8_;
          lVar17 = lVar16 * uVar18 + img_labels.img_._16_8_;
          uVar7 = *(undefined4 *)(lVar17 + -4 + uVar15 * 4);
          piVar1 = (int *)(lVar23 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar17 + uVar15 * 4) = uVar7;
          uVar7 = 6;
          in_R8 = (void *)img_labels.accesses_._16_8_;
          uVar2 = img_labels.accesses_._16_8_;
          iVar13 = 6;
          if (uVar18 != 0) {
            in_R8 = (void *)(uVar15 + 1);
            uVar7 = 6;
            uVar2 = local_1e9._1_8_;
            iVar13 = 6;
            if ((long)in_R8 < lVar10) {
              piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + 4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar7 = 6;
              iVar13 = 6;
              if (*(char *)(uVar15 + 1 + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0') {
                piVar1 = (int *)(lVar23 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar8 = *(uint *)(lVar17 + uVar15 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar22 * (long)pvVar12 + 4 +
                                uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                UF::MemMerge(uVar8,*(uint *)(img_labels.img_._16_8_ + lVar16 * (long)pvVar12 + 4 +
                                            uVar15 * 4));
                uVar7 = 6;
                goto LAB_00198dae;
              }
            }
          }
        }
        else {
          uVar7 = 6;
          if (iVar13 == 5) goto LAB_00198d73;
        }
LAB_00198db0:
        local_1e9._1_8_ = uVar2;
        lVar22 = local_1e0;
        if (((long)uVar20 < local_1e0) &&
           (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar20 + img.accesses_._16_8_ +
                            uVar15 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar15 + *(long *)img.img_._72_8_ * uVar20 + img.img_._16_8_) != '\0')) {
LAB_00199325:
          lVar14 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = *(long *)img_labels.img_._72_8_;
          uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
          piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = lVar21 * uVar20 + img_labels.img_._16_8_;
          in_R8 = (void *)img_labels.img_._16_8_;
          goto LAB_00199a6e;
        }
        break;
      case 7:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) != '\0') {
          if (uVar18 != 0) {
            lVar16 = lVar14 * (long)pvVar12 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar16 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            in_R8 = (void *)(lVar21 * (long)pvVar12 + img.img_._16_8_);
            if (*(char *)(uVar15 + (long)in_R8) != '\0') {
LAB_00198b0a:
              lVar14 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar7 = *(undefined4 *)(lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + uVar15 * 4);
              in_R8 = (void *)(lVar14 * uVar18 + img_labels.accesses_._16_8_);
              piVar1 = (int *)((long)in_R8 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar16 = lVar21 * uVar18 + img_labels.img_._16_8_;
              *(undefined4 *)(lVar16 + uVar15 * 4) = uVar7;
              piVar1 = (int *)((long)in_R8 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar8 = *(uint *)(lVar16 + uVar15 * 4);
              piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              puVar9 = (uint *)(lVar21 * uVar20 + img_labels.img_._16_8_ + uVar15 * 4 + -4);
              iVar13 = 4;
              goto LAB_001998a1;
            }
            if (((long)(uVar15 + 1) < lVar10) &&
               (piVar1 = (int *)(lVar16 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
               *(char *)((long)in_R8 + uVar15 + 1) != '\0')) {
LAB_001996f9:
              lVar14 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + 4 + uVar15 * 4
                              );
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar7 = *(undefined4 *)
                       (lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + 4 + uVar15 * 4);
              in_R8 = (void *)(lVar14 * uVar18 + img_labels.accesses_._16_8_);
              piVar1 = (int *)((long)in_R8 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar16 = lVar21 * uVar18 + img_labels.img_._16_8_;
              *(undefined4 *)(lVar16 + uVar15 * 4) = uVar7;
              piVar1 = (int *)((long)in_R8 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar8 = *(uint *)(lVar16 + uVar15 * 4);
              piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              UF::MemMerge(uVar8,*(uint *)(lVar21 * uVar20 + img_labels.img_._16_8_ + -4 +
                                          uVar15 * 4));
              iVar13 = 5;
              if (uVar15 == 0) goto LAB_001998a8;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar12 + img.accesses_._16_8_
                               + -4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)img.img_._72_8_ * (long)pvVar12 + img.img_._16_8_;
              goto LAB_00199841;
            }
          }
          lVar16 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar16 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar17 = *(long *)img_labels.img_._72_8_;
          uVar7 = *(undefined4 *)(lVar17 * uVar20 + img_labels.img_._16_8_ + -4 + uVar15 * 4);
          lVar16 = lVar16 * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar16 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar17 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4) = uVar7;
          iVar13 = 6;
          in_R8 = (void *)CONCAT71((int7)((ulong)in_R8 >> 8),uVar18 == 0);
          if ((uVar15 != 0 && uVar18 != 0) &&
             (piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + -4 + uVar15 * 4),
             *piVar1 = *piVar1 + 1, in_R8 = pvVar12,
             *(char *)((uVar15 - 1) + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0')) {
            piVar1 = (int *)(lVar16 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_;
            in_R8 = (void *)(*(long *)img_labels.accesses_._72_8_ * (long)pvVar12 +
                            img_labels.accesses_._16_8_);
            uVar8 = *(uint *)(lVar14 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
            piVar1 = (int *)((long)in_R8 + uVar15 * 4 + -4);
            *piVar1 = *piVar1 + 1;
            puVar9 = (uint *)(lVar14 * (long)pvVar12 + img_labels.img_._16_8_ + (uVar15 - 1) * 4);
LAB_001998a1:
            UF::MemMerge(uVar8,*puVar9);
          }
          goto LAB_001998a8;
        }
        goto LAB_00198b8a;
      case 8:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) == '\0') goto LAB_00198d49;
        if (iVar13 == 6) {
          lVar16 = *(long *)img_labels.accesses_._72_8_ * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar16 + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          in_R8 = (void *)(*(long *)img_labels.img_._72_8_ * uVar18 + img_labels.img_._16_8_);
          uVar7 = *(undefined4 *)((long)in_R8 + uVar15 * 4 + -4);
          piVar1 = (int *)(lVar16 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)((long)in_R8 + uVar15 * 4) = uVar7;
          iVar13 = 6;
          uVar7 = 8;
          if (uVar18 != 0) {
            in_R8 = (void *)(uVar15 + 1);
            uVar7 = 8;
            if ((long)in_R8 < lVar10) {
              piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + 4 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              uVar7 = 8;
              if (*(char *)(uVar15 + 1 + img.img_._16_8_ + lVar21 * (long)pvVar12) != '\0') {
                lVar14 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)img_labels.img_._72_8_;
                uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
                piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + 4 +
                                uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                in_R8 = pvVar12;
                UF::MemMerge(uVar8,*(uint *)(lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + 4 +
                                            uVar15 * 4));
                uVar7 = 8;
                goto LAB_001992de;
              }
            }
          }
        }
        else if (iVar13 == 5) {
          lVar14 = *(long *)img_labels.accesses_._72_8_ * uVar18 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar14 + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = *(long *)img_labels.img_._72_8_ * uVar18 + img_labels.img_._16_8_;
          uVar7 = *(undefined4 *)(lVar21 + -4 + uVar15 * 4);
          piVar1 = (int *)(lVar14 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar21 + uVar15 * 4) = uVar7;
          uVar7 = 5;
LAB_001992de:
          iVar13 = 5;
        }
        else {
          uVar7 = 8;
          if (iVar13 == 4) {
            lVar16 = *(long *)img_labels.accesses_._72_8_ * uVar18 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar16 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            in_R8 = (void *)(*(long *)img_labels.img_._72_8_ * uVar18 + img_labels.img_._16_8_);
            uVar7 = *(undefined4 *)((long)in_R8 + uVar15 * 4 + -4);
            piVar1 = (int *)(lVar16 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)in_R8 + uVar15 * 4) = uVar7;
            iVar13 = 6;
            uVar7 = 4;
            if (uVar18 != 0) {
              lVar16 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
              piVar1 = (int *)(lVar16 + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = img.img_._16_8_ + lVar21 * (long)pvVar12;
              uVar7 = 4;
              iVar13 = 4;
              if (*(char *)(uVar15 + lVar14) == '\0') {
                iVar13 = 6;
                uVar7 = 4;
                if ((long)(uVar15 + 1) < lVar10) {
                  piVar1 = (int *)(lVar16 + 4 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar7 = 4;
                  if (*(char *)(lVar14 + 1 + uVar15) != '\0') {
                    lVar14 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar21 = *(long *)img_labels.img_._72_8_;
                    uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
                    piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + 4 +
                                    uVar15 * 4);
                    *piVar1 = *piVar1 + 1;
                    in_R8 = pvVar12;
                    UF::MemMerge(uVar8,*(uint *)(lVar21 * (long)pvVar12 + img_labels.img_._16_8_ + 4
                                                + uVar15 * 4));
                    uVar7 = 4;
                    goto LAB_001992de;
                  }
                }
              }
            }
          }
        }
        if ((lVar22 <= (long)uVar20) ||
           (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar20 + img.accesses_._16_8_ +
                            uVar15 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar15 + *(long *)img.img_._72_8_ * uVar20 + img.img_._16_8_) == '\0')) break;
        goto LAB_00199325;
      case 9:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) != '\0') {
          if (uVar18 != 0) {
            lVar16 = lVar14 * (long)pvVar12 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar16 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar17 = lVar21 * (long)pvVar12 + img.img_._16_8_;
            if (*(char *)(uVar15 + lVar17) != '\0') goto LAB_00198b0a;
            if (((long)(uVar15 + 1) < lVar10) &&
               (piVar1 = (int *)(lVar16 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar17 + 1 + uVar15) != '\0')) goto LAB_001996f9;
          }
          lVar16 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar16 * uVar20 + img_labels.accesses_._16_8_ + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar17 = *(long *)img_labels.img_._72_8_;
          uVar7 = *(undefined4 *)(lVar17 * uVar20 + img_labels.img_._16_8_ + -4 + uVar15 * 4);
          piVar1 = (int *)(lVar16 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar17 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4) = uVar7;
          in_R8 = (void *)CONCAT71(img_labels.accesses_._17_7_,uVar15 == 0 || uVar18 == 0);
          iVar13 = 6;
          if (uVar15 != 0 && uVar18 != 0) {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * (long)pvVar12 + -4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = img.img_._16_8_ + lVar21 * (long)pvVar12;
LAB_00199841:
            if (*(char *)((uVar15 - 1) + lVar14) != '\0') {
              lVar14 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
              piVar1 = (int *)(lVar14 * (long)pvVar12 + img_labels.accesses_._16_8_ + -4 +
                              uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              in_R8 = (void *)(lVar21 * (long)pvVar12 + img_labels.img_._16_8_);
              puVar9 = (uint *)((long)in_R8 + (uVar15 - 1) * 4);
              goto LAB_001998a1;
            }
          }
          goto LAB_001998a8;
        }
LAB_00198b8a:
        if (((long)uVar20 < lVar22) &&
           (piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * uVar20 + uVar15 * 4),
           *piVar1 = *piVar1 + 1, *(char *)(uVar15 + img.img_._16_8_ + lVar21 * uVar20) != '\0')) {
          lVar21 = *(long *)img_labels.accesses_._72_8_ * uVar20 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar21 + -4 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = *(long *)img_labels.img_._72_8_ * uVar20 + img_labels.img_._16_8_;
          uVar8 = *(uint *)(lVar14 + -4 + uVar15 * 4);
          piVar1 = (int *)(lVar21 + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          uVar7 = 9;
          goto LAB_00199a6e;
        }
LAB_00198f3e:
        uVar7 = 1;
        break;
      case 0xffffffff:
        lVar14 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar14 * uVar18 + img.accesses_._16_8_ + uVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = *(long *)img.img_._72_8_;
        if (*(char *)(uVar15 + lVar21 * uVar18 + img.img_._16_8_) != '\0') {
          if (uVar18 == 0) {
LAB_001993da:
            uVar8 = UF::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar18 +
                             img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = *(long *)img_labels.img_._72_8_;
            iVar13 = 6;
          }
          else {
            lVar14 = img.accesses_._16_8_ + lVar14 * (long)pvVar12;
            piVar1 = (int *)(lVar14 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = img.img_._16_8_ + lVar21 * (long)pvVar12;
            if (*(char *)(uVar15 + lVar21) == '\0') {
              in_R8 = pvVar12;
              if ((lVar10 <= (long)(uVar15 + 1)) ||
                 (piVar1 = (int *)(lVar14 + 4 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + 1 + uVar15) == '\0')) goto LAB_001993da;
              lVar21 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar21 * (long)pvVar12 + img_labels.accesses_._16_8_ + 4 + uVar15 * 4
                              );
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)img_labels.img_._72_8_;
              uVar8 = *(uint *)(lVar14 * (long)pvVar12 + img_labels.img_._16_8_ + 4 + uVar15 * 4);
              piVar1 = (int *)(lVar21 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              iVar13 = 5;
            }
            else {
              lVar21 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar21 * (long)pvVar12 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar14 = *(long *)img_labels.img_._72_8_;
              uVar8 = *(uint *)(lVar14 * (long)pvVar12 + img_labels.img_._16_8_ + uVar15 * 4);
              piVar1 = (int *)(lVar21 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              iVar13 = 4;
              in_R8 = pvVar12;
            }
          }
          *(uint *)(lVar14 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4) = uVar8;
LAB_001999df:
          if (((long)uVar20 < lVar22) &&
             (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar20 + img.accesses_._16_8_ +
                              uVar15 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(uVar15 + *(long *)img.img_._72_8_ * uVar20 + img.img_._16_8_) != '\0')) {
            lVar14 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar14 * uVar18 + img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = *(long *)img_labels.img_._72_8_;
            uVar8 = *(uint *)(lVar21 * uVar18 + img_labels.img_._16_8_ + uVar15 * 4);
            piVar1 = (int *)(lVar14 * uVar20 + img_labels.accesses_._16_8_ + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar14 = lVar21 * uVar20 + img_labels.img_._16_8_;
            uVar7 = 2;
            goto LAB_00199a6e;
          }
          uVar7 = 2;
          break;
        }
        if (((long)uVar20 < lVar22) &&
           (piVar1 = (int *)(img.accesses_._16_8_ + lVar14 * uVar20 + uVar15 * 4),
           *piVar1 = *piVar1 + 1, *(char *)(uVar15 + img.img_._16_8_ + lVar21 * uVar20) != '\0')) {
          uVar8 = UF::MemNewLabel();
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar20 +
                           img_labels.accesses_._16_8_ + uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = *(long *)img_labels.img_._72_8_ * uVar20 + img_labels.img_._16_8_;
          goto LAB_00198e8c;
        }
        goto LAB_00198f3e;
      }
    }
    uVar18 = uVar18 + 2;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img(r,c)>0
#define CONDITION_B r+1<h && img(r + 1, c)>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img(r - 1, c - 1)>0
#define CONDITION_N2 r-1>=0 && img(r - 1, c)>0
#define CONDITION_N3 r-1>=0 && c+1<w && img(r - 1, c + 1)>0
#define CONDITION_N4 c-1>=0 && img(r, c - 1)>0
#define CONDITION_N5 c-1>=0 && r+1<h && img(r + 1, c - 1)>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // a <- n1
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // a <- n2
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // a <- n3
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // a <- n4
#define ACTION_7 img_labels(r, c) = img_labels(r + 1, c - 1); // a <- n5
#define ACTION_8 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c - 1)); // a + n1
#define ACTION_9 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c + 1)); // a + n3
#define ACTION_10 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r + 1, c - 1)); // a + n5
#define ACTION_11 img_labels(r + 1, c) = LabelsSolver::MemNewLabel(); // b new label
#define ACTION_12 img_labels(r + 1, c) = img_labels(r, c - 1); // b <- n4
#define ACTION_13 img_labels(r + 1, c) = img_labels(r + 1, c - 1); // b <- n5
#define ACTION_14 img_labels(r + 1, c) = img_labels(r, c); // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i,c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
    }